

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtree.c
# Opt level: O0

void rbtree_rotate_left(RBTREE *tree,RBTREE_NODE *parent,RBTREE_NODE *node)

{
  RBTREE_NODE *pRVar1;
  RBTREE_NODE *tmp;
  RBTREE_NODE *node_local;
  RBTREE_NODE *parent_local;
  RBTREE *tree_local;
  
  pRVar1 = node->r;
  node->r = (RBTREE_NODE *)((ulong)pRVar1->lc & 0xfffffffffffffffe);
  pRVar1->lc = (RBTREE_NODE *)((ulong)node | (ulong)pRVar1->lc & 1);
  if (parent == (RBTREE_NODE *)0x0) {
    tree->root = pRVar1;
  }
  else if (node == (RBTREE_NODE *)((ulong)parent->lc & 0xfffffffffffffffe)) {
    parent->lc = (RBTREE_NODE *)((ulong)pRVar1 | (ulong)parent->lc & 1);
  }
  else if (node == parent->r) {
    parent->r = pRVar1;
  }
  return;
}

Assistant:

static void
rbtree_rotate_left(RBTREE* tree, RBTREE_NODE* parent, RBTREE_NODE* node)
{
    RBTREE_NODE* tmp;

    tmp = RIGHT(node);
    SET_RIGHT(node, LEFT(tmp));
    SET_LEFT(tmp, node);

    if(parent != NULL) {
        if(node == LEFT(parent))
            SET_LEFT(parent, tmp);
        else if(node == RIGHT(parent))
            SET_RIGHT(parent, tmp);
    } else {
        tree->root = tmp;
    }
}